

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O0

int __thiscall deqp::egl::PreservingSwapTests::init(PreservingSwapTests *this,EVP_PKEY_CTX *ctx)

{
  DrawType preSwapDrawType_00;
  EglTestContext *eglTestCtx;
  undefined4 postSwapDrawType_00;
  int iVar1;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  PreservingSwapTest *this_02;
  char *pcVar2;
  char *pcVar3;
  bool preserveColorbuffer;
  bool readPixelsBeforeSwap_00;
  undefined1 local_88 [8];
  string name;
  DrawType postSwapDrawType;
  int postSwapDrawTypeNdx;
  DrawType preSwapDrawType;
  int preSwapDrawTypeNdx;
  TestCaseGroup *readPixelsBeforeSwapGroup;
  int local_48;
  bool readPixelsBeforeSwap;
  int readPixelsNdx;
  TestCaseGroup *preserveGroup;
  bool preserve;
  undefined8 uStack_28;
  int preserveNdx;
  DrawType postSwapDrawTypes [3];
  DrawType preSwapDrawTypes [3];
  PreservingSwapTests *this_local;
  
  postSwapDrawTypes[1] = DRAWTYPE_NONE;
  postSwapDrawTypes[2] = DRAWTYPE_GLES2_CLEAR;
  uStack_28 = 0x100000000;
  iVar1 = 2;
  postSwapDrawTypes[0] = DRAWTYPE_GLES2_RENDER;
  preserveGroup._4_4_ = 0;
  while (preserveGroup._4_4_ < 2) {
    preserveColorbuffer = preserveGroup._4_4_ == 0;
    this_00 = (TestCaseGroup *)operator_new(0x78);
    pcVar3 = "no_preserve";
    if (preserveColorbuffer) {
      pcVar3 = "preserve";
    }
    TestCaseGroup::TestCaseGroup(this_00,(this->super_TestCaseGroup).m_eglTestCtx,pcVar3,"");
    for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
      readPixelsBeforeSwap_00 = local_48 == 1;
      this_01 = (TestCaseGroup *)operator_new(0x78);
      pcVar3 = "no_read_before_swap";
      if (readPixelsBeforeSwap_00) {
        pcVar3 = "read_before_swap";
      }
      pcVar2 = "";
      TestCaseGroup::TestCaseGroup(this_01,(this->super_TestCaseGroup).m_eglTestCtx,pcVar3,"");
      for (postSwapDrawTypeNdx = 0; postSwapDrawTypeNdx < 3;
          postSwapDrawTypeNdx = postSwapDrawTypeNdx + 1) {
        preSwapDrawType_00 = postSwapDrawTypes[(long)postSwapDrawTypeNdx + 1];
        for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 3;
            name.field_2._12_4_ = name.field_2._12_4_ + 1) {
          name.field_2._8_4_ =
               *(DrawType *)((long)&stack0xffffffffffffffd8 + (long)(int)name.field_2._12_4_ * 4);
          if ((preserveColorbuffer) || (name.field_2._8_4_ != DRAWTYPE_NONE)) {
            (anonymous_namespace)::generateTestName_abi_cxx11_
                      ((string *)local_88,(_anonymous_namespace_ *)(ulong)preSwapDrawType_00,
                       name.field_2._8_4_,(DrawType)pcVar2);
            this_02 = (PreservingSwapTest *)operator_new(0x1ae8);
            postSwapDrawType_00 = name.field_2._8_4_;
            eglTestCtx = (this->super_TestCaseGroup).m_eglTestCtx;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            pcVar2 = (char *)(ulong)readPixelsBeforeSwap_00;
            anon_unknown_0::PreservingSwapTest::PreservingSwapTest
                      (this_02,eglTestCtx,preserveColorbuffer,readPixelsBeforeSwap_00,
                       preSwapDrawType_00,postSwapDrawType_00,pcVar3,"");
            tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)this_02);
            std::__cxx11::string::~string((string *)local_88);
          }
        }
      }
      tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)this_01);
    }
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    iVar1 = preserveGroup._4_4_ + 1;
    preserveGroup._4_4_ = iVar1;
  }
  return iVar1;
}

Assistant:

void PreservingSwapTests::init (void)
{
	const PreservingSwapTest::DrawType preSwapDrawTypes[] =
	{
		PreservingSwapTest::DRAWTYPE_NONE,
		PreservingSwapTest::DRAWTYPE_GLES2_CLEAR,
		PreservingSwapTest::DRAWTYPE_GLES2_RENDER
	};

	const PreservingSwapTest::DrawType postSwapDrawTypes[] =
	{
		PreservingSwapTest::DRAWTYPE_NONE,
		PreservingSwapTest::DRAWTYPE_GLES2_CLEAR,
		PreservingSwapTest::DRAWTYPE_GLES2_RENDER
	};

	for (int preserveNdx = 0; preserveNdx < 2; preserveNdx++)
	{
		const bool				preserve		= (preserveNdx == 0);
		TestCaseGroup* const	preserveGroup	= new TestCaseGroup(m_eglTestCtx, (preserve ? "preserve" : "no_preserve"), "");

		for (int readPixelsNdx = 0; readPixelsNdx < 2; readPixelsNdx++)
		{
			const bool				readPixelsBeforeSwap		= (readPixelsNdx == 1);
			TestCaseGroup* const	readPixelsBeforeSwapGroup	= new TestCaseGroup(m_eglTestCtx, (readPixelsBeforeSwap ? "read_before_swap" : "no_read_before_swap"), "");

			for (int preSwapDrawTypeNdx = 0; preSwapDrawTypeNdx < DE_LENGTH_OF_ARRAY(preSwapDrawTypes); preSwapDrawTypeNdx++)
			{
				const PreservingSwapTest::DrawType preSwapDrawType = preSwapDrawTypes[preSwapDrawTypeNdx];

				for (int postSwapDrawTypeNdx = 0; postSwapDrawTypeNdx < DE_LENGTH_OF_ARRAY(postSwapDrawTypes); postSwapDrawTypeNdx++)
				{
					const PreservingSwapTest::DrawType postSwapDrawType = postSwapDrawTypes[postSwapDrawTypeNdx];

					// If not preserving and rendering after swap, then there is nothing to verify
					if (!preserve && postSwapDrawType == PreservingSwapTest::DRAWTYPE_NONE)
						continue;

					const std::string name = generateTestName(preSwapDrawType, postSwapDrawType);

					readPixelsBeforeSwapGroup->addChild(new PreservingSwapTest(m_eglTestCtx, preserve, readPixelsBeforeSwap, preSwapDrawType, postSwapDrawType, name.c_str(), ""));
				}
			}

			preserveGroup->addChild(readPixelsBeforeSwapGroup);
		}

		addChild(preserveGroup);
	}
}